

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::costsEvaluation
          (OptimalControlProblem *this,double time,VectorDynSize *state,VectorDynSize *control,
          double *costValue)

{
  bool bVar1;
  char cVar2;
  _Rb_tree_node_base *p_Var3;
  ostream *poVar4;
  string *psVar5;
  _Rb_tree_header *p_Var6;
  double addCost;
  ostringstream errorMsg;
  double local_1d0;
  char *local_1c8 [4];
  ostringstream local_1a8 [376];
  
  *costValue = 0.0;
  p_Var3 = (this->m_pimpl->costs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var6 = &(this->m_pimpl->costs)._M_t._M_impl.super__Rb_tree_header;
  do {
    if ((_Rb_tree_header *)p_Var3 == p_Var6) {
LAB_0017fad1:
      return (_Rb_tree_header *)p_Var3 == p_Var6;
    }
    bVar1 = TimeRange::isInRange((TimeRange *)&p_Var3[8]._M_left,time);
    if (bVar1) {
      cVar2 = (**(code **)(**(long **)(p_Var3 + 2) + 0x10))
                        (time,*(long **)(p_Var3 + 2),state,control,&local_1d0);
      if (cVar2 == '\0') {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        poVar4 = std::operator<<((ostream *)local_1a8,"Error while evaluating cost ");
        psVar5 = Cost::name_abi_cxx11_(*(Cost **)(p_Var3 + 2));
        poVar4 = std::operator<<(poVar4,(string *)psVar5);
        std::operator<<(poVar4,".");
        std::__cxx11::stringbuf::str();
        iDynTree::reportError("OptimalControlProblem","costsEvaluation",local_1c8[0]);
        std::__cxx11::string::~string((string *)local_1c8);
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
        goto LAB_0017fad1;
      }
      *costValue = (double)p_Var3[8]._M_parent * local_1d0 + *costValue;
    }
    p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  } while( true );
}

Assistant:

bool OptimalControlProblem::costsEvaluation(double time, const VectorDynSize &state, const VectorDynSize &control, double &costValue)
        {
            costValue = 0;
            double addCost;
            for(auto& cost : m_pimpl->costs){
                if (cost.second.timeRange.isInRange(time)){
                    if(!cost.second.cost->costEvaluation(time, state, control, addCost)){
                        std::ostringstream errorMsg;
                        errorMsg << "Error while evaluating cost " << cost.second.cost->name() <<".";
                        reportError("OptimalControlProblem", "costsEvaluation", errorMsg.str().c_str());
                        return false;
                    }
                    costValue += cost.second.weight*addCost;
                }
            }

            return true;
        }